

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O0

qsizetype __thiscall
QLatin1StringMatcher::indexIn_helper<QStringView>
          (QLatin1StringMatcher *this,QStringView haystack,qsizetype from)

{
  longlong lVar1;
  QLatin1StringView s;
  bool bVar2;
  qsizetype qVar3;
  storage_type_conflict *psVar4;
  q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
  *this_00;
  longlong *plVar5;
  long in_RCX;
  storage_type_conflict *in_RDX;
  qsizetype in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  R_conflict12 RVar6;
  QLatin1StringView QVar7;
  R_conflict12 RVar8;
  bool needleLongerThanBuffer;
  qsizetype bufferSize;
  storage_type_conflict *found;
  storage_type_conflict *end;
  storage_type_conflict *begin;
  storage_type_conflict *start;
  QStringView restHaystack;
  QLatin1StringView restNeedle;
  QStringView *in_stack_fffffffffffffe78;
  QLatin1String *in_stack_fffffffffffffe80;
  qsizetype in_stack_fffffffffffffe88;
  longlong lVar9;
  QLatin1String *in_stack_fffffffffffffe90;
  char16_t *in_stack_fffffffffffffe98;
  char16_t *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  QLatin1String *pat_first;
  char16_t *in_stack_fffffffffffffec0;
  storage_type_conflict *last;
  char16_t *in_stack_fffffffffffffec8;
  storage_type_conflict *first;
  q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
  *in_stack_fffffffffffffed0;
  long local_a0;
  difference_type local_90;
  long local_78;
  qsizetype local_70;
  QStringView local_68;
  qsizetype local_58;
  storage_type_conflict *local_50;
  QLatin1StringView local_48;
  longlong local_38;
  qsizetype local_30;
  qsizetype local_28;
  storage_type_conflict *psStack_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_size = in_RSI;
  local_18.m_data = in_RDX;
  bVar2 = QLatin1String::isEmpty((QLatin1String *)0x4c3bb1);
  if (bVar2) {
    qVar3 = QStringView::size(&local_18);
    local_90 = in_RCX;
    if (in_RCX == qVar3) goto LAB_004c4087;
  }
  local_a0 = in_RCX;
  if (in_RCX < 0) {
    qVar3 = QStringView::size(&local_18);
    local_a0 = qVar3 + in_RCX;
  }
  qVar3 = QStringView::size(&local_18);
  if (local_a0 < qVar3) {
    local_28 = local_18.m_size;
    psStack_20 = local_18.m_data;
    psVar4 = indexIn_helper<QStringView>::anon_class_16_1_fba7f966::operator()
                       ((anon_class_16_1_fba7f966 *)0x4c3c7c);
    last = psVar4 + local_a0;
    qVar3 = QStringView::size(&local_18);
    psVar4 = psVar4 + qVar3;
    if ((int)in_RDI[1].m_size == 1) {
      pat_first = in_RDI + 2;
      first = psVar4;
      this_00 = (q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
                 *)QLatin1String::begin((QLatin1String *)0x4c3d33);
      QLatin1String::end(in_stack_fffffffffffffe80);
      RVar6 = QtPrivate::
              q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
              ::operator()(this_00,first,last,(char *)pat_first,in_stack_fffffffffffffeb0);
      RVar8.end = in_stack_fffffffffffffe98;
      RVar8.begin = in_stack_fffffffffffffea0;
      if (RVar6.begin == psVar4) {
        local_90 = -1;
        goto LAB_004c4087;
      }
    }
    else {
      local_30 = QLatin1String::size(in_RDI);
      local_38 = 0x100;
      plVar5 = std::min<long_long>(&local_30,&local_38);
      lVar1 = *plVar5;
      local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.m_data = &DAT_aaaaaaaaaaaaaaaa;
      QVar7 = QLatin1String::sliced(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_48 = QVar7;
      qVar3 = QLatin1String::size(&local_48);
      local_58 = local_18.m_size;
      local_50 = local_18.m_data;
      do {
        RVar8 = QtPrivate::
                q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                ::operator()(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                             in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                             (char *)QVar7.m_size);
        if (RVar8.begin == psVar4) {
          local_90 = -1;
          goto LAB_004c4087;
        }
        if (qVar3 < 1) break;
        local_70 = QStringView::size(&local_18);
        lVar9 = lVar1;
        in_stack_fffffffffffffe90 =
             (QLatin1String *)
             std::distance<char16_t_const*>(RVar8.end,(char16_t *)in_stack_fffffffffffffe90);
        local_78 = (long)&in_stack_fffffffffffffe90->m_size + lVar9;
        qMin<long_long>(&local_70,&local_78);
        local_68 = QStringView::sliced((QStringView *)RVar8.begin,(qsizetype)RVar8.end);
        local_58 = local_68.m_size;
        local_50 = local_68.m_data;
        s.m_data = QVar7.m_data;
        s.m_size = (qsizetype)RVar8.begin;
        bVar2 = QStringView::startsWith(in_stack_fffffffffffffe78,s,CaseInsensitive);
      } while (!bVar2);
    }
    local_90 = std::distance<char16_t_const*>(RVar8.end,(char16_t *)in_stack_fffffffffffffe90);
  }
  else {
    local_90 = -1;
  }
LAB_004c4087:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_90;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QLatin1StringMatcher::indexIn_helper(String haystack, qsizetype from) const noexcept
{
    static_assert(QtPrivate::isLatin1OrUtf16View<String>);

    if (m_pattern.isEmpty() && from == haystack.size())
        return from;
    if (from < 0) // Historical behavior (see QString::indexOf and co.)
        from += haystack.size();
    if (from >= haystack.size())
        return -1;

    const auto start = [haystack] {
        if constexpr (std::is_same_v<String, QStringView>)
            return haystack.utf16();
        else
            return haystack.begin();
    }();

    auto begin = start + from;
    auto end = start + haystack.size();
    auto found = begin;
    if (m_cs == Qt::CaseSensitive) {
        found = m_caseSensitiveSearcher(begin, end, m_pattern.begin(), m_pattern.end()).begin;
        if (found == end)
            return -1;
    } else {
        const qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        const QLatin1StringView restNeedle = m_pattern.sliced(bufferSize);
        const bool needleLongerThanBuffer = restNeedle.size() > 0;
        String restHaystack = haystack;
        do {
            found = m_caseInsensitiveSearcher(found, end, m_foldBuffer, &m_foldBuffer[bufferSize])
                            .begin;
            if (found == end) {
                return -1;
            } else if (!needleLongerThanBuffer) {
                break;
            }
            restHaystack = haystack.sliced(
                    qMin(haystack.size(),
                         bufferSize + qsizetype(std::distance(start, found))));
            if (restHaystack.startsWith(restNeedle, Qt::CaseInsensitive))
                break;
            ++found;
        } while (true);
    }
    return std::distance(start, found);
}